

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_3d_bilinear_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  long lVar21;
  undefined8 *puVar22;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar23;
  long *in_RDI;
  __m128 _v;
  __m128 v1;
  __m128 v0;
  __m128 v11;
  __m128 v10;
  __m128 v01;
  __m128 v00;
  __m128 value;
  __m128 v111_val;
  __m128 v110_val;
  __m128 v101_val;
  __m128 v100_val;
  __m128 v011_val;
  __m128 v010_val;
  __m128 v001_val;
  __m128 v000_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  int local_9bc;
  int *local_970;
  undefined8 *local_920;
  int local_8c8;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  
  lVar20 = in_RSI[7];
  iVar4 = *(int *)((long)in_RSI + 0x2c);
  lVar21 = in_RSI[6];
  iVar5 = *(int *)((long)in_RSI + 0x34);
  for (local_8c8 = 0; local_8c8 < (int)lVar20; local_8c8 = local_8c8 + 1) {
    lVar23 = *in_RDI + in_RDI[8] * (long)local_8c8 * in_RDI[2];
    local_920 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_8c8 * in_RSI[2]);
    local_970 = (int *)*in_RDX;
    for (local_9bc = 0; local_9bc < iVar4 * (int)lVar21 * iVar5; local_9bc = local_9bc + 1) {
      if (*local_970 < 0) {
        local_bd8 = 0;
        uStack_bd0 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)*local_970 * 4);
        local_bd8 = *puVar22;
        uStack_bd0 = puVar22[1];
      }
      if (local_970[1] < 0) {
        local_be8 = 0;
        uStack_be0 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[1] * 4);
        local_be8 = *puVar22;
        uStack_be0 = puVar22[1];
      }
      if (local_970[2] < 0) {
        local_bf8 = 0;
        uStack_bf0 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[2] * 4);
        local_bf8 = *puVar22;
        uStack_bf0 = puVar22[1];
      }
      if (local_970[3] < 0) {
        local_c08 = 0;
        uStack_c00 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[3] * 4);
        local_c08 = *puVar22;
        uStack_c00 = puVar22[1];
      }
      if (local_970[4] < 0) {
        local_c18 = 0;
        uStack_c10 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[4] * 4);
        local_c18 = *puVar22;
        uStack_c10 = puVar22[1];
      }
      if (local_970[5] < 0) {
        local_c28 = 0;
        uStack_c20 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[5] * 4);
        local_c28 = *puVar22;
        uStack_c20 = puVar22[1];
      }
      if (local_970[6] < 0) {
        local_c38 = 0;
        uStack_c30 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[6] * 4);
        local_c38 = *puVar22;
        uStack_c30 = puVar22[1];
      }
      if (local_970[7] < 0) {
        local_c48 = 0;
        uStack_c40 = 0;
      }
      else {
        puVar22 = (undefined8 *)(lVar23 + (long)local_970[7] * 4);
        local_c48 = *puVar22;
        uStack_c40 = puVar22[1];
      }
      fVar1 = (float)local_970[8];
      auVar19._8_8_ = uStack_bd0;
      auVar19._0_8_ = local_bd8;
      local_298 = (float)local_bd8;
      fStack_294 = (float)((ulong)local_bd8 >> 0x20);
      fStack_290 = (float)uStack_bd0;
      fStack_28c = (float)((ulong)uStack_bd0 >> 0x20);
      auVar6._4_4_ = fStack_294 * fVar1;
      auVar6._0_4_ = local_298 * fVar1;
      auVar6._8_4_ = fStack_290 * fVar1;
      auVar6._12_4_ = fStack_28c * fVar1;
      auVar6 = vsubps_avx(auVar19,auVar6);
      local_1b8 = (float)local_be8;
      fStack_1b4 = (float)((ulong)local_be8 >> 0x20);
      fStack_1b0 = (float)uStack_be0;
      fStack_1ac = (float)((ulong)uStack_be0 >> 0x20);
      local_388 = auVar6._0_4_;
      fStack_384 = auVar6._4_4_;
      fStack_380 = auVar6._8_4_;
      fStack_37c = auVar6._12_4_;
      local_388 = local_1b8 * fVar1 + local_388;
      fStack_384 = fStack_1b4 * fVar1 + fStack_384;
      fStack_380 = fStack_1b0 * fVar1 + fStack_380;
      fStack_37c = fStack_1ac * fVar1 + fStack_37c;
      auVar18._8_8_ = uStack_bf0;
      auVar18._0_8_ = local_bf8;
      local_278 = (float)local_bf8;
      fStack_274 = (float)((ulong)local_bf8 >> 0x20);
      fStack_270 = (float)uStack_bf0;
      fStack_26c = (float)((ulong)uStack_bf0 >> 0x20);
      auVar7._4_4_ = fStack_274 * fVar1;
      auVar7._0_4_ = local_278 * fVar1;
      auVar7._8_4_ = fStack_270 * fVar1;
      auVar7._12_4_ = fStack_26c * fVar1;
      auVar6 = vsubps_avx(auVar18,auVar7);
      local_198 = (float)local_c08;
      fStack_194 = (float)((ulong)local_c08 >> 0x20);
      fStack_190 = (float)uStack_c00;
      fStack_18c = (float)((ulong)uStack_c00 >> 0x20);
      local_368 = auVar6._0_4_;
      fStack_364 = auVar6._4_4_;
      fStack_360 = auVar6._8_4_;
      fStack_35c = auVar6._12_4_;
      auVar17._8_8_ = uStack_c10;
      auVar17._0_8_ = local_c18;
      local_258 = (float)local_c18;
      fStack_254 = (float)((ulong)local_c18 >> 0x20);
      fStack_250 = (float)uStack_c10;
      fStack_24c = (float)((ulong)uStack_c10 >> 0x20);
      auVar8._4_4_ = fStack_254 * fVar1;
      auVar8._0_4_ = local_258 * fVar1;
      auVar8._8_4_ = fStack_250 * fVar1;
      auVar8._12_4_ = fStack_24c * fVar1;
      auVar6 = vsubps_avx(auVar17,auVar8);
      local_178 = (float)local_c28;
      fStack_174 = (float)((ulong)local_c28 >> 0x20);
      fStack_170 = (float)uStack_c20;
      fStack_16c = (float)((ulong)uStack_c20 >> 0x20);
      local_348 = auVar6._0_4_;
      fStack_344 = auVar6._4_4_;
      fStack_340 = auVar6._8_4_;
      fStack_33c = auVar6._12_4_;
      local_348 = local_178 * fVar1 + local_348;
      fStack_344 = fStack_174 * fVar1 + fStack_344;
      fStack_340 = fStack_170 * fVar1 + fStack_340;
      fStack_33c = fStack_16c * fVar1 + fStack_33c;
      auVar16._8_8_ = uStack_c30;
      auVar16._0_8_ = local_c38;
      local_238 = (float)local_c38;
      fStack_234 = (float)((ulong)local_c38 >> 0x20);
      fStack_230 = (float)uStack_c30;
      fStack_22c = (float)((ulong)uStack_c30 >> 0x20);
      auVar9._4_4_ = fStack_234 * fVar1;
      auVar9._0_4_ = local_238 * fVar1;
      auVar9._8_4_ = fStack_230 * fVar1;
      auVar9._12_4_ = fStack_22c * fVar1;
      auVar6 = vsubps_avx(auVar16,auVar9);
      local_158 = (float)local_c48;
      fStack_154 = (float)((ulong)local_c48 >> 0x20);
      fStack_150 = (float)uStack_c40;
      fStack_14c = (float)((ulong)uStack_c40 >> 0x20);
      local_328 = auVar6._0_4_;
      fStack_324 = auVar6._4_4_;
      fStack_320 = auVar6._8_4_;
      fStack_31c = auVar6._12_4_;
      fVar2 = (float)local_970[9];
      auVar15._4_4_ = fStack_384;
      auVar15._0_4_ = local_388;
      auVar15._8_4_ = fStack_380;
      auVar15._12_4_ = fStack_37c;
      auVar10._4_4_ = fStack_384 * fVar2;
      auVar10._0_4_ = local_388 * fVar2;
      auVar10._8_4_ = fStack_380 * fVar2;
      auVar10._12_4_ = fStack_37c * fVar2;
      auVar6 = vsubps_avx(auVar15,auVar10);
      local_308 = auVar6._0_4_;
      fStack_304 = auVar6._4_4_;
      fStack_300 = auVar6._8_4_;
      fStack_2fc = auVar6._12_4_;
      local_308 = (local_198 * fVar1 + local_368) * fVar2 + local_308;
      fStack_304 = (fStack_194 * fVar1 + fStack_364) * fVar2 + fStack_304;
      fStack_300 = (fStack_190 * fVar1 + fStack_360) * fVar2 + fStack_300;
      fStack_2fc = (fStack_18c * fVar1 + fStack_35c) * fVar2 + fStack_2fc;
      auVar14._4_4_ = fStack_344;
      auVar14._0_4_ = local_348;
      auVar14._8_4_ = fStack_340;
      auVar14._12_4_ = fStack_33c;
      auVar11._4_4_ = fStack_344 * fVar2;
      auVar11._0_4_ = local_348 * fVar2;
      auVar11._8_4_ = fStack_340 * fVar2;
      auVar11._12_4_ = fStack_33c * fVar2;
      auVar6 = vsubps_avx(auVar14,auVar11);
      local_2e8 = auVar6._0_4_;
      fStack_2e4 = auVar6._4_4_;
      fStack_2e0 = auVar6._8_4_;
      fStack_2dc = auVar6._12_4_;
      fVar3 = (float)local_970[10];
      auVar13._4_4_ = fStack_304;
      auVar13._0_4_ = local_308;
      auVar13._8_4_ = fStack_300;
      auVar13._12_4_ = fStack_2fc;
      auVar12._4_4_ = fStack_304 * fVar3;
      auVar12._0_4_ = local_308 * fVar3;
      auVar12._8_4_ = fStack_300 * fVar3;
      auVar12._12_4_ = fStack_2fc * fVar3;
      auVar6 = vsubps_avx(auVar13,auVar12);
      local_2c8 = auVar6._0_4_;
      fStack_2c4 = auVar6._4_4_;
      fStack_2c0 = auVar6._8_4_;
      fStack_2bc = auVar6._12_4_;
      *local_920 = CONCAT44(((fStack_154 * fVar1 + fStack_324) * fVar2 + fStack_2e4) * fVar3 +
                            fStack_2c4,
                            ((local_158 * fVar1 + local_328) * fVar2 + local_2e8) * fVar3 +
                            local_2c8);
      local_920[1] = CONCAT44(((fStack_14c * fVar1 + fStack_31c) * fVar2 + fStack_2dc) * fVar3 +
                              fStack_2bc,
                              ((fStack_150 * fVar1 + fStack_320) * fVar2 + fStack_2e0) * fVar3 +
                              fStack_2c0);
      local_920 = local_920 + 2;
      local_970 = local_970 + 0xb;
    }
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m128 v000_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            __m128 v001_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
            __m128 v010_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
            __m128 v011_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

            __m128 v100_val = offset_ptr[4] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[4]) : _mm_set1_ps(0);
            __m128 v101_val = offset_ptr[5] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[5]) : _mm_set1_ps(0);
            __m128 v110_val = offset_ptr[6] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[6]) : _mm_set1_ps(0);
            __m128 v111_val = offset_ptr[7] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[7]) : _mm_set1_ps(0);

            __m128 value = _mm_set1_ps(value_ptr[0]);
            __m128 v00 = _mm_comp_fmadd_ps(v001_val, value, _mm_comp_fnmadd_ps(v000_val, value, v000_val));
            __m128 v01 = _mm_comp_fmadd_ps(v011_val, value, _mm_comp_fnmadd_ps(v010_val, value, v010_val));
            __m128 v10 = _mm_comp_fmadd_ps(v101_val, value, _mm_comp_fnmadd_ps(v100_val, value, v100_val));
            __m128 v11 = _mm_comp_fmadd_ps(v111_val, value, _mm_comp_fnmadd_ps(v110_val, value, v110_val));

            value = _mm_set1_ps(value_ptr[1]);
            __m128 v0 = _mm_comp_fmadd_ps(v01, value, _mm_comp_fnmadd_ps(v00, value, v00));
            __m128 v1 = _mm_comp_fmadd_ps(v11, value, _mm_comp_fnmadd_ps(v10, value, v10));

            value = _mm_set1_ps(value_ptr[2]);
            __m128 _v = _mm_comp_fmadd_ps(v1, value, _mm_comp_fnmadd_ps(v0, value, v0));
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 11;
        }
    }
}